

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<double>::SquareMatrix
          (SquareMatrix<double> *this,int64_t size,double value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = double]");
  }
  uVar5 = size * size;
  lVar6 = 0;
  pdVar3 = (double *)operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 * 8);
  auVar2 = _DAT_00167030;
  auVar1 = _DAT_00167020;
  uVar4 = uVar5 + 0x1fffffffffffffff & 0x1fffffffffffffff;
  auVar7._8_4_ = (int)uVar4;
  auVar7._0_8_ = uVar4;
  auVar7._12_4_ = (int)(uVar4 >> 0x20);
  auVar7 = auVar7 ^ _DAT_00167030;
  do {
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8 = (auVar8 | auVar1) ^ auVar2;
    if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                auVar7._4_4_ < auVar8._4_4_) & 1)) {
      pdVar3[lVar6] = value;
    }
    if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
        auVar8._12_4_ <= auVar7._12_4_) {
      pdVar3[lVar6 + 1] = value;
    }
    lVar6 = lVar6 + 2;
  } while ((uVar4 - ((uint)(uVar5 + 0x1fffffffffffffff) & 1)) + 2 != lVar6);
  (this->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = pdVar3;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                ,0x35,
                "qclab::dense::SquareMatrix<double>::SquareMatrix(const int64_t, const T) [T = double]"
               );
}

Assistant:

SquareMatrix( const int64_t size , const T value )
        : size_( size )
        , data_( init_unique_array< T >( size * size , value ) )
        {
          assert( size > 0 ) ;
        }